

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

Result * __thiscall
httplib::ClientImpl::Post
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          MultipartFormDataItems *items)

{
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  detail::make_multipart_data_boundary_abi_cxx11_();
  detail::serialize_multipart_formdata_get_content_type(&local_70,&local_50);
  detail::serialize_multipart_formdata(&local_90,items,&local_50,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,local_70._M_dataplus._M_p,&local_b1);
  Post(__return_storage_ptr__,this,path,headers,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Post(const std::string &path, const Headers &headers,
                               const MultipartFormDataItems &items) {
  const auto &boundary = detail::make_multipart_data_boundary();
  const auto &content_type =
      detail::serialize_multipart_formdata_get_content_type(boundary);
  const auto &body = detail::serialize_multipart_formdata(items, boundary);
  return Post(path, headers, body, content_type.c_str());
}